

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValueAndRemove
          (BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int *key,SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> **value)

{
  bool bVar1;
  SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> **ppSVar2;
  uint local_34;
  int local_30;
  uint targetBucket;
  int last;
  int i;
  SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> **value_local;
  int *key_local;
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  _last = value;
  value_local = (SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> **)key;
  key_local = (int *)this;
  bVar1 = FindEntryWithKey<int>(this,key,(int *)&targetBucket,&local_30,&local_34);
  if (bVar1) {
    ppSVar2 = anon_unknown_6::
              ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
              ::Value((ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                       *)(this->entries + (int)targetBucket));
    *_last = *ppSVar2;
    RemoveAt(this,targetBucket,local_30,local_34);
  }
  return bVar1;
}

Assistant:

bool TryGetValueAndRemove(const TKey& key, TValue* value)
        {
            int i, last;
            uint targetBucket;
            if (FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                *value = entries[i].Value();
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }